

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int MemHashCursorData(unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
                     void *pUserData)

{
  unqlite_kv_engine *puVar1;
  int iVar2;
  mem_hash_cursor *pMem;
  
  puVar1 = pCursor[1].pStore;
  if (puVar1 != (unqlite_kv_engine *)0x0) {
    iVar2 = (*xConsumer)(puVar1[4].pIo,*(uint *)&puVar1[5].pIo,pUserData);
    return iVar2;
  }
  return -0x12;
}

Assistant:

static int MemHashCursorData(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	mem_hash_cursor *pMem = (mem_hash_cursor *)pCursor;
	int rc;
	if( pMem->pCur == 0){
		 return UNQLITE_EOF;
	}
	/* Invoke the callback */
	rc = xConsumer(pMem->pCur->pData,pMem->pCur->nDataLen,pUserData);
	/* Callback result */
	return rc;
}